

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_weierstrass_double(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *dest;
  size_t sVar1;
  WeierstrassPoint *pWVar2;
  size_t sVar3;
  
  wc = wcurve();
  dest = ecc_weierstrass_point_new_identity(wc);
  sVar1 = (*looplimit)(5);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      pWVar2 = wpoint(wc,sVar1);
      ecc_weierstrass_point_copy_into(dest,pWVar2);
      ecc_weierstrass_point_free(pWVar2);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      pWVar2 = ecc_weierstrass_double(dest);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      ecc_weierstrass_point_free(pWVar2);
      sVar1 = sVar1 + 1;
      sVar3 = (*looplimit)(5);
    } while (sVar1 < sVar3);
  }
  ecc_weierstrass_point_free(dest);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_double(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 0; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);

        log_start();
        WeierstrassPoint *r = ecc_weierstrass_double(a);
        log_end();
        ecc_weierstrass_point_free(r);
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
}